

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReturnValues.cc
# Opt level: O2

void __thiscall Calculator::execute(Calculator *this)

{
  ostream *poVar1;
  int sum;
  int local_24;
  anon_class_8_1_ba1d79ab local_20;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Calculating..");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_20.sum = &local_24;
  local_24 = 0;
  sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::operator()
            ((BasicSignal<int(),std::lock_guard<std::mutex>> *)this,&local_20);
  poVar1 = std::operator<<((ostream *)&std::cout,"Sum of calculation: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_24);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void execute()
  {
    std::cout << "Calculating.." << std::endl;

    int sum = 0;
    executeSignal_([&sum](int retVal) {
      std::cout << "Incoming value: " << retVal << std::endl;
      sum += retVal;
    });

    std::cout << "Sum of calculation: " << sum << std::endl;
  }